

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Transmitter_PDU::Transmitter_PDU
          (Transmitter_PDU *this,RadioEntityType *Type,TransmitState TS,RadioInputSource IS,
          AntennaLocation *AL,AntennaPatternType APT,KUINT64 Freq,KFLOAT32 FreqBW,KFLOAT32 Power,
          ModulationType *MT,CryptoSystem *CS,KOCTET *ModulationParams,KUINT8 ModulationParamsLength
          ,KOCTET *AntennaPattern,KUINT16 AntennaPatternLength)

{
  KFLOAT64 KVar1;
  KUINT8 KVar2;
  KUINT16 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT16 KVar6;
  KFLOAT32 KVar7;
  KUINT16 KVar8;
  anon_union_2_2_87a8692b_for_CryptoSystem_2 aVar9;
  
  Radio_Communications_Header::Radio_Communications_Header(&this->super_Radio_Communications_Header)
  ;
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transmitter_PDU_00214ac0;
  (this->m_RadioEntityType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__RadioEntityType_00216770;
  KVar2 = Type->m_ui8Domain;
  KVar3 = Type->m_ui16Country;
  KVar4 = Type->m_ui8Category;
  KVar5 = Type->m_ui8NomenclatureVersion;
  KVar6 = Type->m_ui16Nomenclature;
  (this->m_RadioEntityType).m_ui8EntityKind = Type->m_ui8EntityKind;
  (this->m_RadioEntityType).m_ui8Domain = KVar2;
  (this->m_RadioEntityType).m_ui16Country = KVar3;
  (this->m_RadioEntityType).m_ui8Category = KVar4;
  (this->m_RadioEntityType).m_ui8NomenclatureVersion = KVar5;
  (this->m_RadioEntityType).m_ui16Nomenclature = KVar6;
  this->m_ui8TransmitterState = (KUINT8)TS;
  this->m_ui8InputSource = (KUINT8)IS;
  this->m_ui16Padding1 = 0;
  (this->m_AntennaLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AntennaLocation_00215fa0;
  (this->m_AntennaLocation).m_AntennaLocation.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00216ae8;
  KVar1 = (AL->m_AntennaLocation).m_f64Y;
  (this->m_AntennaLocation).m_AntennaLocation.m_f64X = (AL->m_AntennaLocation).m_f64X;
  (this->m_AntennaLocation).m_AntennaLocation.m_f64Y = KVar1;
  (this->m_AntennaLocation).m_AntennaLocation.m_f64Z = (AL->m_AntennaLocation).m_f64Z;
  (this->m_AntennaLocation).m_RelativeAntennaLocation.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00216a90;
  KVar7 = (AL->m_RelativeAntennaLocation).m_f32Y;
  (this->m_AntennaLocation).m_RelativeAntennaLocation.m_f32X =
       (AL->m_RelativeAntennaLocation).m_f32X;
  (this->m_AntennaLocation).m_RelativeAntennaLocation.m_f32Y = KVar7;
  (this->m_AntennaLocation).m_RelativeAntennaLocation.m_f32Z =
       (AL->m_RelativeAntennaLocation).m_f32Z;
  this->m_ui16AntennaPatternType = (KUINT16)APT;
  this->m_ui16AntennaPatternLength = 0;
  this->m_ui64Freq = Freq;
  this->m_f32TransmitFreqBW = FreqBW;
  this->m_f32Power = Power;
  (this->m_ModulationType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ModulationType_002166c0;
  KVar3 = MT->m_ui16MajorModulationType;
  KVar6 = MT->m_ui16Detail;
  KVar8 = MT->m_ui16System;
  (this->m_ModulationType).field_0 = MT->field_0;
  (this->m_ModulationType).m_ui16MajorModulationType = KVar3;
  (this->m_ModulationType).m_ui16Detail = KVar6;
  (this->m_ModulationType).m_ui16System = KVar8;
  (this->m_CryptoSystem).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__CryptoSystem_00216100;
  aVar9 = CS->field_1;
  (this->m_CryptoSystem).m_ui16CryptoSystemType = CS->m_ui16CryptoSystemType;
  (this->m_CryptoSystem).field_1 = aVar9;
  this->m_ui8LengthOfModulationParam = '\0';
  this->m_ui16Padding2 = 0;
  this->m_ui8Padding3 = '\0';
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x19';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  return;
}

Assistant:

Transmitter_PDU::Transmitter_PDU( const RadioEntityType & Type, TransmitState TS, RadioInputSource IS,
                                  const AntennaLocation & AL, AntennaPatternType APT, KUINT64 Freq,
                                  KFLOAT32 FreqBW, KFLOAT32 Power, const ModulationType & MT,
                                  const CryptoSystem & CS, const KOCTET * ModulationParams,
                                  KUINT8 ModulationParamsLength, const KOCTET * AntennaPattern,
                                  KUINT16 AntennaPatternLength ) :
    m_RadioEntityType( Type ),
    m_ui8TransmitterState( TS ),
    m_ui8InputSource( IS ),
    m_ui16Padding1( 0 ),
    m_AntennaLocation( AL ),
    m_ui16AntennaPatternType( APT ),
    m_ui16AntennaPatternLength( 0 ),
    m_ui64Freq( Freq ),
    m_f32TransmitFreqBW( FreqBW ),
    m_f32Power( Power ),
    m_ModulationType( MT ),
    m_CryptoSystem( CS ),
    m_ui8LengthOfModulationParam( 0 ),
    m_ui16Padding2( 0 ),
    m_ui8Padding3( 0 )
{
    m_ui8PDUType = Transmitter_PDU_Type;
    m_ui16PDULength = TRANSMITTER_PDU_SIZE;
}